

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O2

void duckdb::TupleDataStructWithinCollectionGather
               (TupleDataLayout *layout,Vector *heap_locations,idx_t list_size_before,
               SelectionVector *scan_sel,idx_t scan_count,Vector *target,SelectionVector *target_sel
               ,optional_ptr<duckdb::Vector,_true> list_vector,
               vector<duckdb::TupleDataGatherFunction,_true> *child_functions)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  bool bVar3;
  Vector *pVVar4;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  reference this_00;
  type pVVar5;
  const_reference pvVar6;
  idx_t child_i;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  idx_t row_idx;
  idx_t iVar10;
  optional_ptr<duckdb::Vector,_true> list_vector_local;
  ValidityBytes source_mask;
  
  list_vector_local = list_vector;
  pVVar4 = optional_ptr<duckdb::Vector,_true>::operator*(&list_vector_local);
  pdVar1 = pVVar4->data;
  pVVar4 = optional_ptr<duckdb::Vector,_true>::operator*(&list_vector_local);
  FlatVector::VerifyFlatVector(pVVar4);
  pdVar2 = heap_locations->data;
  FlatVector::VerifyFlatVector(target);
  iVar10 = list_size_before;
  for (iVar9 = 0; iVar9 != scan_count; iVar9 = iVar9 + 1) {
    row_idx = iVar9;
    if (target_sel->sel_vector != (sel_t *)0x0) {
      row_idx = (idx_t)target_sel->sel_vector[iVar9];
    }
    bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(pVVar4->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
    if (bVar3) {
      uVar8 = *(ulong *)(pdVar1 + row_idx * 0x10 + 8);
      if (uVar8 != 0) {
        source_mask.validity_mask = *(uchar **)(pdVar2 + iVar9 * 8);
        source_mask.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        source_mask.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(uchar **)(pdVar2 + iVar9 * 8) = source_mask.validity_mask + (uVar8 + 7 >> 3);
        source_mask.capacity = uVar8;
        for (uVar7 = 0; uVar7 < uVar8; uVar7 = uVar7 + 1) {
          if ((source_mask.validity_mask[uVar7 >> 3] >> ((uint)uVar7 & 7) & 1) == 0) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(target->validity).super_TemplatedValidityMask<unsigned_long>,iVar10 + uVar7
                      );
            uVar8 = *(ulong *)(pdVar1 + row_idx * 0x10 + 8);
          }
        }
        iVar10 = iVar10 + uVar8;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&source_mask.validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
    }
  }
  this = StructVector::GetEntries(target);
  for (uVar8 = 0;
      uVar8 < (ulong)((long)(this->
                            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                            ).
                            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->
                            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                            ).
                            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
              ::get<true>(this,uVar8);
    pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (this_00);
    pvVar6 = vector<duckdb::TupleDataGatherFunction,_true>::get<true>(child_functions,uVar8);
    (*pvVar6->function)(layout,heap_locations,list_size_before,scan_sel,scan_count,pVVar5,target_sel
                        ,(optional_ptr<duckdb::Vector,_true>)list_vector_local.ptr,
                        &pvVar6->child_functions);
  }
  return;
}

Assistant:

static void TupleDataStructWithinCollectionGather(const TupleDataLayout &layout, Vector &heap_locations,
                                                  const idx_t list_size_before, const SelectionVector &scan_sel,
                                                  const idx_t scan_count, Vector &target,
                                                  const SelectionVector &target_sel, optional_ptr<Vector> list_vector,
                                                  const vector<TupleDataGatherFunction> &child_functions) {
	// List parent
	const auto list_entries = FlatVector::GetData<list_entry_t>(*list_vector);
	const auto &list_validity = FlatVector::Validity(*list_vector);

	// Source
	const auto source_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	// Target
	auto &target_validity = FlatVector::Validity(target);

	uint64_t target_offset = list_size_before;
	for (idx_t i = 0; i < scan_count; i++) {
		const auto target_idx = target_sel.get_index(i);
		if (!list_validity.RowIsValid(target_idx)) {
			continue;
		}

		const auto &list_length = list_entries[target_idx].length;
		if (list_length == 0) {
			continue;
		}

		// Initialize validity mask and skip over it
		auto &source_heap_location = source_heap_locations[i];
		ValidityBytes source_mask(source_heap_location, list_length);
		source_heap_location += ValidityBytes::SizeInBytes(list_length);

		// Load the child validity belonging to this list entry
		for (idx_t child_i = 0; child_i < list_length; child_i++) {
			if (!source_mask.RowIsValidUnsafe(child_i)) {
				target_validity.SetInvalid(target_offset + child_i);
			}
		}
		target_offset += list_length;
	}

	// Recurse
	auto &struct_targets = StructVector::GetEntries(target);
	for (idx_t struct_col_idx = 0; struct_col_idx < struct_targets.size(); struct_col_idx++) {
		auto &struct_target = *struct_targets[struct_col_idx];
		const auto &struct_gather_function = child_functions[struct_col_idx];
		struct_gather_function.function(layout, heap_locations, list_size_before, scan_sel, scan_count, struct_target,
		                                target_sel, list_vector, struct_gather_function.child_functions);
	}
}